

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void StoreInLongestMatchCache
               (ZopfliBlockState *s,size_t pos,size_t limit,unsigned_short *sublen,
               unsigned_short distance,unsigned_short length)

{
  ushort uVar1;
  size_t pos_00;
  unsigned_short *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined2 in_R8W;
  ushort in_R9W;
  bool bVar2;
  uchar cache_available;
  size_t lmcpos;
  
  pos_00 = in_RSI - *(long *)(in_RDI + 0x10);
  bVar2 = false;
  if ((*(long *)(in_RDI + 8) != 0) &&
     (bVar2 = true, *(short *)(**(long **)(in_RDI + 8) + pos_00 * 2) != 0)) {
    bVar2 = *(short *)(*(long *)(*(long *)(in_RDI + 8) + 8) + pos_00 * 2) != 0;
  }
  if ((((*(long *)(in_RDI + 8) != 0) && (in_RDX == 0x102)) && (in_RCX != (unsigned_short *)0x0)) &&
     (!bVar2)) {
    if (in_R9W < 3) {
      in_R8W = 0;
    }
    *(undefined2 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + pos_00 * 2) = in_R8W;
    uVar1 = in_R9W;
    if (in_R9W < 3) {
      uVar1 = 0;
    }
    *(ushort *)(**(long **)(in_RDI + 8) + pos_00 * 2) = uVar1;
    ZopfliSublenToCache(in_RCX,pos_00,(ulong)in_R9W,*(ZopfliLongestMatchCache **)(in_RDI + 8));
  }
  return;
}

Assistant:

static void StoreInLongestMatchCache(ZopfliBlockState* s,
    size_t pos, size_t limit,
    const unsigned short* sublen,
    unsigned short distance, unsigned short length) {
  /* The LMC cache starts at the beginning of the block rather than the
     beginning of the whole array. */
  size_t lmcpos = pos - s->blockstart;

  /* Length > 0 and dist 0 is invalid combination, which indicates on purpose
     that this cache value is not filled in yet. */
  unsigned char cache_available = s->lmc && (s->lmc->length[lmcpos] == 0 ||
      s->lmc->dist[lmcpos] != 0);

  if (s->lmc && limit == ZOPFLI_MAX_MATCH && sublen && !cache_available) {
    assert(s->lmc->length[lmcpos] == 1 && s->lmc->dist[lmcpos] == 0);
    s->lmc->dist[lmcpos] = length < ZOPFLI_MIN_MATCH ? 0 : distance;
    s->lmc->length[lmcpos] = length < ZOPFLI_MIN_MATCH ? 0 : length;
    assert(!(s->lmc->length[lmcpos] == 1 && s->lmc->dist[lmcpos] == 0));
    ZopfliSublenToCache(sublen, lmcpos, length, s->lmc);
  }
}